

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_interface.cpp
# Opt level: O2

void * isotree_deserialize_from_file(FILE *serialized_model,int nthreads)

{
  ostream *poVar1;
  _Head_base<0UL,_isotree::IsolationForest_*,_false> _Var2;
  __single_object out;
  undefined1 local_1f0 [480];
  
  if (serialized_model == (FILE *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Passed invalid file handle to \'isotree_deserialize_from_file\'.");
    std::endl<char,std::char_traits<char>>(poVar1);
    _Var2._M_head_impl = (IsolationForest *)0x0;
  }
  else {
    isotree::IsolationForest::deserialize
              ((IsolationForest *)(local_1f0 + 8),serialized_model,nthreads);
    std::make_unique<isotree::IsolationForest,isotree::IsolationForest>
              ((IsolationForest *)local_1f0);
    isotree::IsolationForest::~IsolationForest((IsolationForest *)(local_1f0 + 8));
    _Var2._M_head_impl = (IsolationForest *)local_1f0._0_8_;
    local_1f0._0_8_ =
         (_Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
          )0x0;
    std::unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>::
    ~unique_ptr((unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                 *)local_1f0);
  }
  return _Var2._M_head_impl;
}

Assistant:

ISOTREE_EXPORTED
void* isotree_deserialize_from_file(FILE *serialized_model, int nthreads)
{
    if (!serialized_model) {
        cerr << "Passed invalid file handle to 'isotree_deserialize_from_file'." << std::endl;
        return nullptr;
    }

    try
    {
        #if __cplusplus >= 201402L
        auto out = std::make_unique<IsolationForest>(IsolationForest::deserialize(serialized_model, nthreads));
        #else
        std::unique_ptr<IsolationForest> out(new IsolationForest(std::forward<IsolationForest>(
            IsolationForest::deserialize(serialized_model, nthreads)
        )));
        #endif
        return (void*)out.release();
    }

    catch (std::exception &e)
    {
        cerr << e.what();
        cerr.flush();
        return nullptr;
    }
}